

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryKinematicsModelsLoader.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL::LibraryKinematicsModelsLoader::endTransformation(LibraryKinematicsModelsLoader *this)

{
  _Elt_pointer ppKVar1;
  
  if (this->mCurrentAttachment == (KinematicAttachment *)0x0) {
    ppKVar1 = (this->mLinkStack).c.
              super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppKVar1 ==
        (this->mLinkStack).c.
        super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppKVar1 = (this->mLinkStack).c.
                super__Deque_base<COLLADASaxFWL::KinematicLink_*,_std::allocator<COLLADASaxFWL::KinematicLink_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    KinematicLink::addTransformation
              (ppKVar1[-1],(this->mTransformationLoader).mCurrentTransformation);
  }
  else {
    KinematicAttachment::addTransformation
              (this->mCurrentAttachment,(this->mTransformationLoader).mCurrentTransformation);
  }
  IFilePartLoader::moveUpInSidTree((IFilePartLoader *)this);
  TransformationLoader::endTransformation(&this->mTransformationLoader);
  return true;
}

Assistant:

bool LibraryKinematicsModelsLoader::endTransformation()
	{
		if ( mCurrentAttachment )
		{
			// we are a child of an attachment
			mCurrentAttachment->addTransformation( mTransformationLoader.getCurrentTransformation() );
		}
		else
		{
			// we are a child of a link
			KinematicLink* link = mLinkStack.top();
			link->addTransformation( mTransformationLoader.getCurrentTransformation() );
		}
		moveUpInSidTree();
		mTransformationLoader.endTransformation();
		return true;
	}